

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSR.cpp
# Opt level: O1

Matrix * __thiscall CSR::turnToRegular(CSR *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  int *piVar5;
  int *piVar6;
  double *pdVar7;
  Matrix *this_00;
  long lVar8;
  long lVar9;
  string local_48;
  
  this_00 = (Matrix *)operator_new(0x30);
  iVar1 = this->row;
  iVar2 = this->col;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"turn to regular:","");
  Matrix::Matrix(this_00,iVar1,iVar2,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  iVar1 = this->row;
  if (0 < (long)iVar1) {
    pdVar4 = this->val;
    piVar5 = this->ptr;
    piVar6 = this->idx;
    lVar8 = 0;
    do {
      iVar2 = piVar5[lVar8];
      lVar9 = (long)iVar2;
      iVar3 = piVar5[lVar8 + 1];
      if (iVar2 < iVar3) {
        pdVar7 = this_00->array[lVar8];
        do {
          pdVar7[piVar6[lVar9]] = pdVar4[lVar9];
          lVar9 = lVar9 + 1;
        } while (iVar3 != lVar9);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar1);
  }
  return this_00;
}

Assistant:

Matrix* CSR::turnToRegular()
{

    Matrix *y = new Matrix(row, col, "turn to regular:");

    for (int i = 0; i < row; i++)
    {
        for (int j = ptr[i]; j < ptr[i + 1]; j++)
        {

            y->array[i][idx[j]] = val[j];

        }
    }
    return y;
}